

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

void __thiscall
wasm::BranchUtils::BranchAccumulator::visitExpression(BranchAccumulator *this,Expression *curr)

{
  iterator __first;
  iterator __last;
  undefined1 local_48 [8];
  NameSet selfBranches;
  Expression *curr_local;
  BranchAccumulator *this_local;
  
  selfBranches._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)curr;
  getUniqueTargets((NameSet *)local_48,curr);
  __first = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                      ((NameSet *)local_48);
  __last = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                     ((NameSet *)local_48);
  std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>::
  insert<std::_Rb_tree_const_iterator<wasm::Name>>
            ((set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>> *)&this->branches,
             (_Rb_tree_const_iterator<wasm::Name>)__first._M_node,
             (_Rb_tree_const_iterator<wasm::Name>)__last._M_node);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_48);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    auto selfBranches = getUniqueTargets(curr);
    branches.insert(selfBranches.begin(), selfBranches.end());
  }